

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExpressionTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionTimingCheckArgSyntax,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ExpressionTimingCheckArgSyntax *pEVar1;
  
  pEVar1 = (ExpressionTimingCheckArgSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((ExpressionTimingCheckArgSyntax *)this->endPtr < pEVar1 + 1) {
    pEVar1 = (ExpressionTimingCheckArgSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pEVar1 + 1);
  }
  (pEVar1->super_TimingCheckArgSyntax).super_SyntaxNode.kind = ExpressionTimingCheckArg;
  (pEVar1->super_TimingCheckArgSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar1->super_TimingCheckArgSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }